

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O2

optional<tinyusdz::value::matrix4f> * __thiscall
tinyusdz::primvar::PrimVar::get_value<tinyusdz::value::matrix4f>
          (optional<tinyusdz::value::matrix4f> *__return_storage_ptr__,PrimVar *this)

{
  bool bVar1;
  optional<tinyusdz::value::matrix4f> local_5c;
  
  bVar1 = is_blocked(this);
  if ((!bVar1) && (bVar1 = has_value(this), bVar1)) {
    tinyusdz::value::Value::get_value<tinyusdz::value::matrix4f>(&local_5c,&this->_value,false);
    __return_storage_ptr__->has_value_ = local_5c.has_value_;
    if (local_5c.has_value_ != true) {
      return __return_storage_ptr__;
    }
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x30) = local_5c.contained._48_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x38) = local_5c.contained._56_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x20) = local_5c.contained._32_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x28) = local_5c.contained._40_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x10) = local_5c.contained._16_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x18) = local_5c.contained._24_8_;
    *(undefined8 *)&__return_storage_ptr__->contained = local_5c.contained._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 8) = local_5c.contained._8_8_;
    return __return_storage_ptr__;
  }
  __return_storage_ptr__->has_value_ = false;
  *(undefined8 *)&__return_storage_ptr__->contained = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->contained + 8) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x10) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x18) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x20) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x28) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x30) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x38) = 0;
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value() const {

    if (is_blocked()) {
      return nonstd::nullopt;
    }

    if (!has_default()) {
      return nonstd::nullopt;
    }

    return _value.get_value<T>();
  }